

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::AnalyzeDependencyForFile
               (FileDescriptor *file,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *nodes_without_dependency,
               map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
               *deps,map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     *dependency_count)

{
  __type _Var1;
  FileDescriptor *pFVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this;
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  *this_00;
  int iVar5;
  int i;
  int index;
  FileDescriptor *dependency;
  FileDescriptor *local_80;
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_78;
  FileDescriptor *local_70;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_68;
  
  iVar5 = *(int *)(file + 0x20);
  index = 0;
  local_80 = file;
  local_78 = (_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)nodes_without_dependency;
  do {
    if (*(int *)(file + 0x20) <= index) goto LAB_002b7100;
    pFVar2 = FileDescriptor::dependency(file,index);
    _Var1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             pFVar2,&kDescriptorFile_abi_cxx11_);
    index = index + 1;
  } while (!_Var1);
  iVar5 = iVar5 + -1;
LAB_002b7100:
  if (iVar5 == 0) {
    std::
    _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>(local_78,&local_80);
  }
  else {
    pmVar3 = std::
             map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
             ::operator[](dependency_count,&local_80);
    *pmVar3 = iVar5;
    for (iVar5 = 0; iVar5 < *(int *)(local_80 + 0x20); iVar5 = iVar5 + 1) {
      local_70 = FileDescriptor::dependency(local_80,iVar5);
      _Var1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )local_70,&kDescriptorFile_abi_cxx11_);
      if (!_Var1) {
        iVar4 = std::
                _Rb_tree<const_google::protobuf::FileDescriptor_*,_std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_std::_Select1st<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                ::find(&deps->_M_t,&local_70);
        if ((_Rb_tree_header *)iVar4._M_node == &(deps->_M_t)._M_impl.super__Rb_tree_header) {
          local_68._M_impl._0_8_ = 0;
          local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_68._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_68._M_impl.super__Rb_tree_header._M_header;
          local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_68._M_impl.super__Rb_tree_header._M_header._M_right =
               local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          this = &std::
                  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                  ::operator[](deps,&local_70)->_M_t;
          std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::operator=(this,&local_68);
          std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::~_Rb_tree(&local_68);
        }
        this_00 = (_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                   *)std::
                     map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                     ::operator[](deps,&local_70);
        std::
        _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>(this_00,&local_80);
        AnalyzeDependencyForFile
                  (local_70,(set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             *)local_78,deps,dependency_count);
      }
    }
  }
  return;
}

Assistant:

static void AnalyzeDependencyForFile(
    const FileDescriptor* file,
    std::set<const FileDescriptor*>* nodes_without_dependency,
    std::map<const FileDescriptor*, std::set<const FileDescriptor*>>* deps,
    std::map<const FileDescriptor*, int>* dependency_count) {
  int count = file->dependency_count();
  for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        count--;
        break;
      }
  }

  if (count == 0) {
    nodes_without_dependency->insert(file);
  } else {
    (*dependency_count)[file] = count;
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        continue;
      }
      if (deps->find(dependency) == deps->end()) {
        (*deps)[dependency] = std::set<const FileDescriptor*>();
      }
      (*deps)[dependency].insert(file);
      AnalyzeDependencyForFile(
          dependency, nodes_without_dependency, deps, dependency_count);
    }
  }
}